

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O0

CNscPStackEntry *
NscBuildStructDeclarationList(CNscPStackEntry *pList,CNscPStackEntry *pDeclaration)

{
  NscType NVar1;
  uchar *pauchData;
  CNscPStackEntry *in_RSI;
  CNscContext *in_RDI;
  CNscPStackEntry *pDeclarationEntry;
  CNscPStackEntry *pOut;
  undefined4 in_stack_ffffffffffffffc8;
  NscType in_stack_ffffffffffffffcc;
  CNscContext *in_stack_ffffffffffffffd0;
  undefined8 local_18;
  
  local_18 = in_RDI;
  if (in_RDI == (CNscContext *)0x0) {
    local_18 = (CNscContext *)
               CNscContext::GetPStackEntry
                         (in_stack_ffffffffffffffd0,
                          (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
    CNscPStackEntry::SetType((CNscPStackEntry *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc)
    ;
  }
  NVar1 = CNscPStackEntry::GetType((CNscPStackEntry *)local_18);
  if (NVar1 != NscType_Error) {
    NVar1 = CNscPStackEntry::GetType(in_RSI);
    if (NVar1 == NscType_Error) {
      CNscPStackEntry::SetType
                ((CNscPStackEntry *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    }
    else {
      in_stack_ffffffffffffffd0 = local_18;
      pauchData = CNscPStackEntry::GetData(in_RSI);
      CNscPStackEntry::GetDataSize(in_RSI);
      CNscPStackEntry::AppendData(in_RSI,pauchData,(size_t)in_stack_ffffffffffffffd0);
    }
  }
  CNscContext::FreePStackEntry
            (in_stack_ffffffffffffffd0,
             (CNscPStackEntry *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  return (CNscPStackEntry *)local_18;
}

Assistant:

YYSTYPE NscBuildStructDeclarationList (YYSTYPE pList, YYSTYPE pDeclaration)
{
	CNscPStackEntry *pOut = pList;

	//
	// If there isn't an list, then create
	//

	if (pOut == NULL)
	{
		pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);
		pOut ->SetType (NscType_Unknown);
	}

	//
	// Process the parameter
	//

	CNscPStackEntry *pDeclarationEntry = pDeclaration;
	if (pOut ->GetType () != NscType_Error)
	{
		if (pDeclarationEntry ->GetType () != NscType_Error)
		{
			pOut ->AppendData (pDeclarationEntry ->GetData (),
				pDeclarationEntry ->GetDataSize ());
		}
		else
			pOut ->SetType (NscType_Error);
	}
	g_pCtx ->FreePStackEntry (pDeclarationEntry);


	//
	// Return the new expression
	//

	return pOut;
}